

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

opj_bool dwt_decode_real(opj_tcd_tilecomp_t *tilec,int numres)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  bool bVar8;
  undefined8 uVar9;
  int x;
  uint uVar10;
  int *piVar11;
  v4 *__ptr;
  undefined4 *puVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  float *pfVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  float *pfVar21;
  uint uVar22;
  opj_tcd_resolution_t *poVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  uint local_100;
  v4dwt_t local_c8;
  v4dwt_t local_b0;
  long local_98;
  long local_90;
  long local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  long local_60;
  float *local_58;
  long local_50;
  long local_48;
  ulong local_40;
  float *local_38;
  
  iVar20 = numres + -1;
  if (iVar20 == 0) {
    __ptr = (v4 *)malloc(0x50);
  }
  else {
    poVar23 = tilec->resolutions;
    iVar19 = poVar23->x1;
    iVar2 = poVar23->y1;
    iVar3 = poVar23->x0;
    iVar4 = poVar23->y0;
    iVar5 = tilec->x1;
    iVar6 = tilec->x0;
    x = iVar5 - iVar6;
    piVar11 = &poVar23[1].y1;
    uVar10 = 0;
    iVar13 = iVar20;
    do {
      uVar18 = piVar11[-1] - ((opj_tcd_resolution_t *)(piVar11 + -3))->x0;
      if (uVar18 < uVar10) {
        uVar18 = uVar10;
      }
      uVar10 = *piVar11 - piVar11[-2];
      if ((uint)(*piVar11 - piVar11[-2]) < uVar18) {
        uVar10 = uVar18;
      }
      piVar11 = piVar11 + 0x26;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    __ptr = (v4 *)malloc((ulong)(uVar10 + 5) << 4);
    local_c8.wavelet = __ptr;
    local_b0.wavelet = __ptr;
    if (iVar20 != 0) {
      pfVar7 = (float *)tilec->data;
      iVar13 = (tilec->y1 - tilec->y0) * x;
      local_48 = (long)(x * 4);
      local_60 = (long)iVar5 * 4 + (long)iVar6 * -4;
      local_68 = pfVar7 + (((long)iVar5 + -1) - (long)iVar6);
      local_50 = local_48 * 4;
      local_70 = pfVar7 + (long)(x * 2) + -1;
      local_90 = (long)(x * 2) << 2;
      local_78 = pfVar7 + (long)(x * 3) + -1;
      local_80 = pfVar7 + -1;
      local_88 = (long)__ptr + -4;
      local_98 = (long)__ptr + -8;
      uVar10 = iVar19 - iVar3;
      local_100 = iVar2 - iVar4;
      do {
        local_c8.sn = local_100;
        uVar18 = poVar23[1].x1 - poVar23[1].x0;
        uVar22 = poVar23[1].y1 - poVar23[1].y0;
        local_b0.dn = uVar18 - uVar10;
        local_b0.cas = poVar23[1].x0 % 2;
        pfVar17 = pfVar7;
        iVar19 = iVar13;
        local_b0.sn = uVar10;
        if (3 < (int)uVar22) {
          lVar14 = (long)(int)uVar18;
          pfVar24 = local_68 + lVar14;
          pfVar25 = local_70 + lVar14;
          pfVar26 = local_78 + lVar14;
          pfVar21 = local_80 + lVar14;
          local_58 = (float *)(lVar14 * 0x10 + local_88);
          uVar10 = uVar22;
          do {
            local_40 = (ulong)uVar10;
            local_38 = pfVar17;
            v4dwt_interleave_h(&local_b0,pfVar17,x,iVar19);
            v4dwt_decode(&local_b0);
            if (0 < (int)uVar18) {
              lVar15 = 0;
              pfVar17 = local_58;
              do {
                pfVar21[lVar15] = pfVar17[-3];
                pfVar24[lVar15] = pfVar17[-2];
                pfVar25[lVar15] = pfVar17[-1];
                pfVar26[lVar15] = *pfVar17;
                lVar1 = lVar14 + lVar15;
                lVar15 = lVar15 + -1;
                pfVar17 = pfVar17 + -4;
              } while (1 < lVar1);
            }
            pfVar17 = local_38 + local_48;
            iVar19 = iVar19 - (int)local_48;
            uVar10 = (int)local_40 - 4;
            pfVar24 = (float *)((long)pfVar24 + local_50);
            pfVar25 = (float *)((long)pfVar25 + local_50);
            pfVar26 = (float *)((long)pfVar26 + local_50);
            pfVar21 = (float *)((long)pfVar21 + local_50);
          } while (7 < (int)local_40);
        }
        lVar14 = local_60;
        uVar10 = uVar22 & 3;
        pfVar24 = pfVar7;
        if (uVar10 == 0) {
LAB_0020441c:
          local_c8.dn = uVar22 - local_100;
          local_c8.cas = poVar23[1].y0 % 2;
          if (3 < (int)uVar18) {
            uVar10 = uVar18;
            do {
              v4dwt_interleave_v(&local_c8,pfVar24,x,4);
              v4dwt_decode(&local_c8);
              if (0 < (int)uVar22) {
                lVar15 = 0;
                pfVar17 = pfVar24;
                do {
                  uVar9 = ((undefined8 *)((long)__ptr + lVar15))[1];
                  *(undefined8 *)pfVar17 = *(undefined8 *)((long)__ptr + lVar15);
                  *(undefined8 *)(pfVar17 + 2) = uVar9;
                  pfVar17 = (float *)((long)pfVar17 + lVar14);
                  lVar15 = lVar15 + 0x10;
                } while ((ulong)uVar22 << 4 != lVar15);
              }
              pfVar24 = pfVar24 + 4;
              bVar8 = 7 < (int)uVar10;
              uVar10 = uVar10 - 4;
            } while (bVar8);
          }
        }
        else {
          v4dwt_interleave_h(&local_b0,pfVar17,x,iVar19);
          v4dwt_decode(&local_b0);
          if (0 < (int)uVar18) {
            uVar16 = (ulong)uVar18 + 1;
            puVar12 = (undefined4 *)((ulong)uVar18 * 0x10 + local_98);
            do {
              if (uVar10 != 1) {
                if (uVar10 != 2) {
                  *(undefined4 *)((long)pfVar17 + uVar16 * 4 + local_90 + -8) = *puVar12;
                }
                *(undefined4 *)((long)pfVar17 + uVar16 * 4 + lVar14 + -8) = puVar12[-1];
              }
              pfVar17[uVar16 - 2] = (float)puVar12[-2];
              uVar16 = uVar16 - 1;
              puVar12 = puVar12 + -4;
            } while (1 < uVar16);
            goto LAB_0020441c;
          }
          local_c8.dn = uVar22 - local_100;
          local_c8.cas = poVar23[1].y0 % 2;
        }
        uVar10 = uVar18 & 3;
        if (uVar10 != 0) {
          v4dwt_interleave_v(&local_c8,pfVar24,x,uVar10);
          v4dwt_decode(&local_c8);
          if (0 < (int)uVar22) {
            lVar15 = 0;
            do {
              memcpy(pfVar24,(void *)((long)__ptr + lVar15),(ulong)(uVar10 << 2));
              pfVar24 = (float *)((long)pfVar24 + lVar14);
              lVar15 = lVar15 + 0x10;
            } while ((ulong)uVar22 << 4 != lVar15);
          }
        }
        poVar23 = poVar23 + 1;
        iVar20 = iVar20 + -1;
        uVar10 = uVar18;
        local_100 = uVar22;
      } while (iVar20 != 0);
    }
  }
  free(__ptr);
  return 1;
}

Assistant:

opj_bool dwt_decode_real(opj_tcd_tilecomp_t* restrict tilec, int numres){
	v4dwt_t h;
	v4dwt_t v;

	opj_tcd_resolution_t* res = tilec->resolutions;

	int rw = res->x1 - res->x0;	/* width of the resolution level computed */
	int rh = res->y1 - res->y0;	/* height of the resolution level computed */

	int w = tilec->x1 - tilec->x0;

	h.wavelet = (v4*) opj_aligned_malloc((dwt_max_resolution(res, numres)+5) * sizeof(v4));
	v.wavelet = h.wavelet;

	while( --numres) {
		float * restrict aj = (float*) tilec->data;
		int bufsize = (tilec->x1 - tilec->x0) * (tilec->y1 - tilec->y0);
		int j;

		h.sn = rw;
		v.sn = rh;

		++res;

		rw = res->x1 - res->x0;	/* width of the resolution level computed */
		rh = res->y1 - res->y0;	/* height of the resolution level computed */

		h.dn = rw - h.sn;
		h.cas = res->x0 % 2;

		for(j = rh; j > 3; j -= 4){
			int k;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					aj[k    ] = h.wavelet[k].f[0];
					aj[k+w  ] = h.wavelet[k].f[1];
					aj[k+w*2] = h.wavelet[k].f[2];
					aj[k+w*3] = h.wavelet[k].f[3];
				}
			aj += w*4;
			bufsize -= w*4;
		}
		if (rh & 0x03) {
				int k;
			j = rh & 0x03;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					switch(j) {
						case 3: aj[k+w*2] = h.wavelet[k].f[2];
						case 2: aj[k+w  ] = h.wavelet[k].f[1];
						case 1: aj[k    ] = h.wavelet[k].f[0];
					}
				}
			}

		v.dn = rh - v.sn;
		v.cas = res->y0 % 2;

		aj = (float*) tilec->data;
		for(j = rw; j > 3; j -= 4){
			int k;
			v4dwt_interleave_v(&v, aj, w, 4);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], 4 * sizeof(float));
				}
			aj += 4;
		}
		if (rw & 0x03){
				int k;
			j = rw & 0x03;
			v4dwt_interleave_v(&v, aj, w, j);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], j * sizeof(float));
				}
			}
	}

	opj_aligned_free(h.wavelet);
	return OPJ_TRUE;
}